

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

void __thiscall
slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
visitDefault<slang::syntax::ParenthesizedSequenceExprSyntax_const&>
          (SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *this,
          ParenthesizedSequenceExprSyntax *node)

{
  bool bVar1;
  SyntaxNode *this_00;
  SyntaxNode *pSVar2;
  SyntaxNode *in_RDI;
  Token TVar3;
  MetadataVisitor *in_stack_00000020;
  Token token;
  SyntaxNode *child;
  uint32_t i;
  MetadataVisitor *in_stack_ffffffffffffffa8;
  SyntaxNode *in_stack_ffffffffffffffc0;
  SyntaxNode *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_14;
  
  local_14 = 0;
  local_30 = in_stack_ffffffffffffffc0;
  local_28 = in_stack_ffffffffffffffc8;
  while( true ) {
    this_00 = (SyntaxNode *)(ulong)local_14;
    pSVar2 = (SyntaxNode *)SyntaxNode::getChildCount(in_RDI);
    if (pSVar2 <= this_00) break;
    pSVar2 = SyntaxNode::childNode(local_28,(size_t)local_30);
    if (pSVar2 == (SyntaxNode *)0x0) {
      TVar3 = SyntaxNode::childToken(local_30,(size_t)in_RDI);
      bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x917366);
      if (bVar1) {
        local_30 = TVar3._0_8_;
        local_28 = (SyntaxNode *)TVar3.info;
        parsing::anon_unknown_4::MetadataVisitor::visitToken(in_stack_00000020,token);
      }
    }
    else {
      SyntaxNode::visit<slang::parsing::(anonymous_namespace)::MetadataVisitor>
                (this_00,in_stack_ffffffffffffffa8);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }